

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonDom.cc
# Opt level: O2

Entity __thiscall avro::json::readEntity(json *this,JsonParser *p)

{
  shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>_>
  *psVar1;
  element_type *this_00;
  element_type *this_01;
  Token TVar2;
  domain_error *this_02;
  placeholder *extraout_RDX;
  placeholder *extraout_RDX_00;
  placeholder *extraout_RDX_01;
  placeholder *extraout_RDX_02;
  placeholder *extraout_RDX_03;
  placeholder *extraout_RDX_04;
  any aVar3;
  Entity EVar4;
  shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>_>
  v_1;
  string k;
  shared_ptr<std::vector<avro::json::Entity,_std::allocator<avro::json::Entity>_>_> v;
  Entity n;
  
  TVar2 = JsonParser::peek(p);
  switch(TVar2) {
  case tkNull:
    JsonParser::advance(p);
    *(undefined4 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    aVar3.content = extraout_RDX;
    break;
  case tkBool:
    JsonParser::advance(p);
    Entity::Entity((Entity *)this,p->bv);
    aVar3.content = extraout_RDX_01;
    break;
  case tkLong:
    JsonParser::advance(p);
    Entity::Entity((Entity *)this,p->lv);
    aVar3.content = extraout_RDX_02;
    break;
  case tkDouble:
    JsonParser::advance(p);
    Entity::Entity((Entity *)this,p->dv);
    aVar3.content = extraout_RDX_03;
    break;
  case tkString:
    JsonParser::advance(p);
    std::__cxx11::string::string((string *)&v,(string *)&p->sv);
    boost::make_shared<std::__cxx11::string,std::__cxx11::string>
              ((boost *)&k,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v);
    Entity::Entity((Entity *)this,
                   (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&k);
    boost::detail::shared_count::~shared_count((shared_count *)&k._M_string_length);
    std::__cxx11::string::~string((string *)&v);
    aVar3.content = extraout_RDX_00;
    break;
  case tkArrayStart:
    JsonParser::advance(p);
    boost::make_shared<std::vector<avro::json::Entity,std::allocator<avro::json::Entity>>>();
    while (TVar2 = JsonParser::peek(p), this_01 = v.px, TVar2 != tkArrayEnd) {
      readEntity((json *)&k,p);
      std::vector<avro::json::Entity,_std::allocator<avro::json::Entity>_>::
      emplace_back<avro::json::Entity>(this_01,(Entity *)&k);
      if (k._M_string_length != 0) {
        (**(code **)(*(long *)k._M_string_length + 8))();
      }
    }
    JsonParser::advance(p);
    Entity::Entity((Entity *)this,&v);
    psVar1 = (shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>_>
              *)&v;
    goto LAB_001bad99;
  default:
    this_02 = (domain_error *)__cxa_allocate_exception(0x10);
    TVar2 = JsonParser::peek(p);
    std::domain_error::domain_error(this_02,*(char **)(JsonParser::tokenNames + (ulong)TVar2 * 8));
    __cxa_throw(this_02,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  case tkObjectStart:
    JsonParser::advance(p);
    boost::
    make_shared<std::map<std::__cxx11::string,avro::json::Entity,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,avro::json::Entity>>>>
              ();
    while (TVar2 = JsonParser::peek(p), TVar2 != tkObjectEnd) {
      JsonParser::advance(p);
      std::__cxx11::string::string((string *)&k,(string *)&p->sv);
      readEntity((json *)&n,p);
      this_00 = v_1.px;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_avro::json::Entity_&,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>
                  *)&v,&k,&n);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,avro::json::Entity>,std::_Select1st<std::pair<std::__cxx11::string_const,avro::json::Entity>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,avro::json::Entity>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,avro::json::Entity>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,avro::json::Entity>,std::_Select1st<std::pair<std::__cxx11::string_const,avro::json::Entity>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,avro::json::Entity>>>
                  *)this_00,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>
                  *)&v);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>
               *)&v);
      if (n.value_.content != (placeholder *)0x0) {
        (*(n.value_.content)->_vptr_placeholder[1])();
      }
      std::__cxx11::string::~string((string *)&k);
    }
    JsonParser::advance(p);
    Entity::Entity((Entity *)this,&v_1);
    psVar1 = &v_1;
LAB_001bad99:
    boost::detail::shared_count::~shared_count(&psVar1->pn);
    aVar3.content = extraout_RDX_04;
  }
  EVar4.value_.content = aVar3.content;
  EVar4._0_8_ = this;
  return EVar4;
}

Assistant:

Entity readEntity(JsonParser& p)
{
    switch (p.peek()) {
    case JsonParser::tkNull:
        p.advance();
        return Entity();
    case JsonParser::tkBool:
        p.advance();
        return Entity(p.boolValue());
    case JsonParser::tkLong:
        p.advance();
        return Entity(p.longValue());
    case JsonParser::tkDouble:
        p.advance();
        return Entity(p.doubleValue());
    case JsonParser::tkString:
        p.advance();
        return Entity(boost::make_shared<String>(p.stringValue()));
    case JsonParser::tkArrayStart:
        {
            p.advance();
            boost::shared_ptr<Array> v = boost::make_shared<Array>();
            while (p.peek() != JsonParser::tkArrayEnd) {
                v->push_back(readEntity(p));
            }
            p.advance();
            return Entity(v);
        }
    case JsonParser::tkObjectStart:
        {
            p.advance();
            boost::shared_ptr<Object> v = boost::make_shared<Object>();
            while (p.peek() != JsonParser::tkObjectEnd) {
                p.advance();
                std::string k = p.stringValue();
                Entity n = readEntity(p);
                v->insert(std::make_pair(k, n));
            }
            p.advance();
            return Entity(v);
        }
    default:
        throw std::domain_error(JsonParser::toString(p.peek()));
    }
    
}